

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444.c
# Opt level: O2

uint64_t rfc5497_timetlv_decode(uint8_t encoded)

{
  ulong uVar1;
  undefined3 in_register_00000039;
  
  if (CONCAT31(in_register_00000039,encoded) == 0) {
    return 0;
  }
  if (CONCAT31(in_register_00000039,encoded) == 0xff) {
    return 0xffffffffffffffff;
  }
  uVar1 = (ulong)(encoded & 7) * 0x7d + 1000;
  if (encoded < 0x58) {
    return uVar1 >> (10 - (encoded >> 3) & 0x3f);
  }
  return uVar1 << ((encoded >> 3) - 10 & 0x3f);
}

Assistant:

uint64_t
rfc5497_timetlv_decode(uint8_t encoded) {
  /*
   * time-value := (1 + a/8) * 2^b * C
   * time-code := 8 * b + a
   */
  uint8_t a, b;

  if (encoded == 0) {
    /* minimum valid time interval */
    return 0;
  }

  if (encoded == 255) {
    /* return 'infinite' */
    return UINT64_MAX;
  }

  a = encoded & 0x07;
  b = encoded >> 3;

  /*
   * C is 1000/1024 for us, because we calculate in ms
   *
   * t = (1 + a/8) * 2^b * 1000 / 1024
   *   = (1000 + 125 * a) * 2^b / 2^10
   *
   * Case 1: b <= 10
   *   = (1000 + 125 * a) >> (10 - b)
   *
   * Case 2: b > 10
   *   = (1000 + 125 * a) << (b - 10)
   */

  if (b <= 10) {
    return (1000ull + 125ull * a) >> (10ull - b);
  }
  return (1000ull + 125ull * a) << (b - 10ull);
}